

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall logger::OutputWorker::Write(OutputWorker *this,LogStringBuffer *buffer)

{
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::__cxx11::stringbuf::str();
  std::mutex::lock(&this->QueueLock);
  if ((this->QueuePublic).
      super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
      ._M_impl._M_node._M_size < 0x400) {
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,std::allocator<logger::OutputWorker::QueuedMessage>>::
    emplace_back<logger::Level&,char_const*&,std::__cxx11::string&>
              ((list<logger::OutputWorker::QueuedMessage,std::allocator<logger::OutputWorker::QueuedMessage>>
                *)&this->QueuePublic,&buffer->LogLevel,&buffer->ChannelName,&bStack_38);
  }
  else {
    LOCK();
    (this->Overrun).super___atomic_base<int>._M_i =
         (this->Overrun).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->QueueLock);
  std::condition_variable::notify_all();
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void OutputWorker::Write(LogStringBuffer& buffer)
{
    std::string str = buffer.LogStream.str();

#if defined(_WIN32)
    // If a debugger is present:
    if (CachedIsDebuggerPresent)
    {
        // Log all messages immediately to the Visual Studio Output Window
        // to allow logging while single-stepping in a debugger.
        ::OutputDebugStringA((str + "\n").c_str());
    }
#endif // _WIN32

#if defined(LOGGER_NEVER_DROP)
    for (;; Flush())
    {
        std::lock_guard<std::mutex> locker(QueueLock);

        if (QueuePublic.size() >= kWorkQueueLimit)
        {
            continue;
        }
        else
        {
            QueuePublic.emplace_back(buffer.LogLevel, buffer.ChannelName, str);
            break;
        }
    }
#else // LOGGER_NEVER_DROP
    {
        std::lock_guard<std::mutex> locker(QueueLock);

        if (QueuePublic.size() >= kWorkQueueLimit)
            Overrun++;
        else
            QueuePublic.emplace_back(buffer.LogLevel, buffer.ChannelName, str);
    }
#endif // LOGGER_NEVER_DROP

    QueueCondition.notify_all();
}